

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O2

void __thiscall sjtu::TrainManager::add_train(TrainManager *this,int argc,string *argv)

{
  undefined1 *this_00;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar1;
  DynamicFileManager<sjtu::trainType> *pDVar2;
  TrainManager *pTVar3;
  size_type *psVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  undefined4 extraout_var;
  invalid_command *this_01;
  ulong uVar9;
  undefined8 extraout_RDX;
  long lVar10;
  int iVar11;
  long lVar12;
  string *psVar13;
  char *pcVar14;
  pair<long,_bool> pVar15;
  string local_258;
  TrainManager *local_238;
  StringHasher *local_230;
  size_type *local_228;
  string stopoverTimes;
  string travelTimes;
  string prices;
  string stations;
  string saleDate;
  string trainID;
  timeType local_160;
  string type;
  string startTime;
  string seatNum;
  string stationNum;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  char *__dest;
  
  trainID._M_dataplus._M_p = (pointer)&trainID.field_2;
  trainID._M_string_length = 0;
  stationNum._M_dataplus._M_p = (pointer)&stationNum.field_2;
  stationNum._M_string_length = 0;
  trainID.field_2._M_local_buf[0] = '\0';
  seatNum._M_dataplus._M_p = (pointer)&seatNum.field_2;
  seatNum._M_string_length = 0;
  stations._M_dataplus._M_p = (pointer)&stations.field_2;
  stations._M_string_length = 0;
  stationNum.field_2._M_local_buf[0] = '\0';
  seatNum.field_2._M_local_buf[0] = '\0';
  prices._M_dataplus._M_p = (pointer)&prices.field_2;
  prices._M_string_length = 0;
  startTime._M_dataplus._M_p = (pointer)&startTime.field_2;
  startTime._M_string_length = 0;
  stations.field_2._M_local_buf[0] = '\0';
  prices.field_2._M_local_buf[0] = '\0';
  travelTimes._M_dataplus._M_p = (pointer)&travelTimes.field_2;
  travelTimes._M_string_length = 0;
  stopoverTimes._M_dataplus._M_p = (pointer)&stopoverTimes.field_2;
  stopoverTimes._M_string_length = 0;
  startTime.field_2._M_local_buf[0] = '\0';
  travelTimes.field_2._M_local_buf[0] = '\0';
  saleDate._M_dataplus._M_p = (pointer)&saleDate.field_2;
  saleDate._M_string_length = 0;
  type._M_dataplus._M_p = (pointer)&type.field_2;
  type._M_string_length = 0;
  stopoverTimes.field_2._M_local_buf[0] = '\0';
  saleDate.field_2._M_local_buf[0] = '\0';
  type.field_2._M_local_buf[0] = '\0';
  local_238 = this;
  for (lVar12 = 0; pTVar3 = local_238, lVar12 < argc; lVar12 = lVar12 + 2) {
    bVar5 = std::operator==(argv,"-i");
    psVar13 = &trainID;
    if ((!bVar5) && (bVar5 = std::operator==(argv,"-n"), psVar13 = &stationNum, !bVar5)) {
      bVar5 = std::operator==(argv,"-m");
      psVar13 = &seatNum;
      if (!bVar5) {
        bVar5 = std::operator==(argv,"-s");
        psVar13 = &stations;
        if (!bVar5) {
          bVar5 = std::operator==(argv,"-p");
          psVar13 = &prices;
          if (!bVar5) {
            bVar5 = std::operator==(argv,"-x");
            psVar13 = &startTime;
            if (!bVar5) {
              bVar5 = std::operator==(argv,"-t");
              psVar13 = &travelTimes;
              if (!bVar5) {
                bVar5 = std::operator==(argv,"-o");
                psVar13 = &stopoverTimes;
                if (!bVar5) {
                  bVar5 = std::operator==(argv,"-d");
                  psVar13 = &saleDate;
                  if (!bVar5) {
                    bVar5 = std::operator==(argv,"-y");
                    psVar13 = &type;
                    if (!bVar5) {
                      this_01 = (invalid_command *)__cxa_allocate_exception(0x68);
                      invalid_command::invalid_command(this_01);
                      __cxa_throw(this_01,&invalid_command::typeinfo,
                                  invalid_command::~invalid_command);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::_M_assign((string *)psVar13);
    argv = argv + 2;
  }
  pBVar1 = local_238->TrainBpTree;
  std::__cxx11::string::string((string *)&local_50,(string *)&trainID);
  this_00 = &pTVar3->field_0x10;
  local_258._M_dataplus._M_p = (pointer)StringHasher::operator()((StringHasher *)this_00,&local_50);
  pVar15 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                     (pBVar1,(unsigned_long_long *)&local_258);
  std::__cxx11::string::~string((string *)&local_50);
  if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_230 = (StringHasher *)this_00;
    iVar6 = (*(pTVar3->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base[1]
            )();
    __dest = (char *)CONCAT44(extraout_var,iVar6);
    *(undefined8 *)(__dest + 0xa7a0) = extraout_RDX;
    __dest[0xa799] = '\0';
    strcpy(__dest,trainID._M_dataplus._M_p);
    iVar6 = std::__cxx11::stoi(&stationNum,(size_t *)0x0,10);
    *(int *)(__dest + 0x18) = iVar6;
    iVar6 = std::__cxx11::stoi(&seatNum,(size_t *)0x0,10);
    local_228 = (size_type *)(__dest + 0xa7a0);
    *(int *)(__dest + 0x1c) = iVar6;
    pcVar14 = __dest;
    for (lVar12 = 0; uVar9 = (ulong)*(int *)(__dest + 0x18), lVar10 = 0x13, lVar12 < (long)uVar9;
        lVar12 = lVar12 + 1) {
      for (; lVar10 != 0x6f; lVar10 = lVar10 + 1) {
        *(int *)(pcVar14 + lVar10 * 4) = iVar6;
      }
      pcVar14 = pcVar14 + 0x1a8;
    }
    iVar7 = (int)stations._M_string_length;
    iVar6 = 0;
    for (lVar12 = 0; lVar12 < (int)uVar9; lVar12 = lVar12 + 1) {
      lVar10 = (long)iVar6;
      iVar11 = iVar7;
      if (iVar7 < iVar6) {
        iVar11 = iVar6;
      }
      for (; lVar10 < iVar7; lVar10 = lVar10 + 1) {
        if (stations._M_dataplus._M_p[lVar10] == '|') {
          iVar11 = (int)lVar10;
          break;
        }
      }
      std::__cxx11::string::substr((ulong)&local_258,(ulong)&stations);
      strcpy(__dest + lVar12 * 0x1a8 + 0x20,local_258._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_258);
      iVar6 = iVar11 + 1;
      uVar9 = (ulong)*(uint *)(__dest + 0x18);
    }
    iVar6 = (int)prices._M_string_length;
    iVar7 = 0;
    for (lVar12 = 1; lVar12 < (int)uVar9; lVar12 = lVar12 + 1) {
      lVar10 = (long)iVar7;
      iVar11 = iVar6;
      if (iVar6 < iVar7) {
        iVar11 = iVar7;
      }
      for (; lVar10 < iVar6; lVar10 = lVar10 + 1) {
        if (prices._M_dataplus._M_p[lVar10] == '|') {
          iVar11 = (int)lVar10;
          break;
        }
      }
      std::__cxx11::string::substr((ulong)&local_258,(ulong)&prices);
      iVar7 = std::__cxx11::stoi(&local_258,(size_t *)0x0,10);
      *(int *)(__dest + lVar12 * 0x1a8 + 0x1bc) = iVar7;
      std::__cxx11::string::~string((string *)&local_258);
      iVar7 = iVar11 + 1;
      uVar9 = (ulong)*(uint *)(__dest + 0x18);
    }
    std::__cxx11::string::string((string *)&local_70,(string *)&startTime);
    timeType::timeType((timeType *)&local_258,&local_70);
    *(pointer *)(__dest + 0xa788) = local_258._M_dataplus._M_p;
    *(size_type *)(__dest + 0xa790) = local_258._M_string_length;
    std::__cxx11::string::~string((string *)&local_70);
    iVar6 = (int)travelTimes._M_string_length;
    iVar7 = 0;
    for (lVar12 = 1; uVar9 = (ulong)*(int *)(__dest + 0x18), lVar12 < (long)uVar9;
        lVar12 = lVar12 + 1) {
      lVar10 = (long)iVar7;
      iVar11 = iVar6;
      if (iVar6 < iVar7) {
        iVar11 = iVar7;
      }
      for (; lVar10 < iVar6; lVar10 = lVar10 + 1) {
        if (travelTimes._M_dataplus._M_p[lVar10] == '|') {
          iVar11 = (int)lVar10;
          break;
        }
      }
      std::__cxx11::string::substr((ulong)&local_258,(ulong)&travelTimes);
      iVar7 = std::__cxx11::stoi(&local_258,(size_t *)0x0,10);
      *(int *)(__dest + lVar12 * 0x1a8 + 0x1c4) = iVar7;
      std::__cxx11::string::~string((string *)&local_258);
      iVar7 = iVar11 + 1;
    }
    iVar7 = (int)stopoverTimes._M_string_length;
    iVar6 = 0;
    for (lVar12 = 1; lVar12 < (int)uVar9 + -1; lVar12 = lVar12 + 1) {
      lVar10 = (long)iVar6;
      iVar11 = iVar7;
      if (iVar7 < iVar6) {
        iVar11 = iVar6;
      }
      for (; lVar10 < iVar7; lVar10 = lVar10 + 1) {
        if (stopoverTimes._M_dataplus._M_p[lVar10] == '|') {
          iVar11 = (int)lVar10;
          break;
        }
      }
      std::__cxx11::string::substr((ulong)&local_258,(ulong)&stopoverTimes);
      iVar6 = std::__cxx11::stoi(&local_258,(size_t *)0x0,10);
      *(int *)(__dest + lVar12 * 0x1a8 + 0x1c0) = iVar6;
      std::__cxx11::string::~string((string *)&local_258);
      iVar6 = iVar11 + 1;
      uVar9 = (ulong)*(uint *)(__dest + 0x18);
    }
    std::__cxx11::string::substr((ulong)&local_90,(ulong)&saleDate);
    timeType::timeType((timeType *)&local_258,&local_90);
    psVar4 = local_228;
    pTVar3 = local_238;
    *(pointer *)(__dest + 0xa768) = local_258._M_dataplus._M_p;
    *(size_type *)(__dest + 0xa770) = local_258._M_string_length;
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)&saleDate);
    timeType::timeType(&local_160,&local_b0);
    *(undefined8 *)(__dest + 0xa778) = local_160._0_8_;
    *(undefined8 *)(__dest + 0xa780) = local_160._8_8_;
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    __dest[0xa798] = *type._M_dataplus._M_p;
    pDVar2 = pTVar3->TrainFile;
    (*(pDVar2->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base[3])(pDVar2,psVar4);
    pBVar1 = pTVar3->TrainBpTree;
    std::__cxx11::string::string((string *)&local_d0,__dest,(allocator *)&local_160);
    local_258._M_dataplus._M_p = (pointer)StringHasher::operator()(local_230,&local_d0);
    local_258._M_string_length = *psVar4;
    BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::insert
              (pBVar1,(value_type *)&local_258);
    std::__cxx11::string::~string((string *)&local_d0);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  else {
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  std::__cxx11::string::~string((string *)&type);
  std::__cxx11::string::~string((string *)&saleDate);
  std::__cxx11::string::~string((string *)&stopoverTimes);
  std::__cxx11::string::~string((string *)&travelTimes);
  std::__cxx11::string::~string((string *)&startTime);
  std::__cxx11::string::~string((string *)&prices);
  std::__cxx11::string::~string((string *)&stations);
  std::__cxx11::string::~string((string *)&seatNum);
  std::__cxx11::string::~string((string *)&stationNum);
  std::__cxx11::string::~string((string *)&trainID);
  return;
}

Assistant:

void add_train(int argc , std::string *argv)
		{
			std::string trainID , stationNum , seatNum , stations , prices , startTime , travelTimes , stopoverTimes , saleDate , type;
			for (int i = 0;i < argc;i += 2)
				if (argv[i] == "-i") trainID = argv[i + 1];
				else if (argv[i] == "-n") stationNum = argv[i + 1];
				else if (argv[i] == "-m") seatNum = argv[i + 1];
				else if (argv[i] == "-s") stations = argv[i + 1];
				else if (argv[i] == "-p") prices = argv[i + 1];
				else if (argv[i] == "-x") startTime = argv[i + 1];
				else if (argv[i] == "-t") travelTimes = argv[i + 1];
				else if (argv[i] == "-o") stopoverTimes = argv[i + 1];
				else if (argv[i] == "-d") saleDate = argv[i + 1];
				else if (argv[i] == "-y") type = argv[i + 1];
				else throw invalid_command();
			if (TrainBpTree -> find(hasher(trainID)).second) std::cout << -1 << std::endl;
			else
			{
				auto ret = TrainFile -> newspace();
				trainType *train = ret.first;
				train -> offset = ret.second , train -> is_released = false;
				strcpy(train -> trainID , trainID.c_str());
				train -> stationNum = stoi(stationNum) , train -> seatNum = stoi(seatNum);
				for (int i = 0;i < train -> stationNum;++ i)
					for (int j = 0;j < 92;++ j)
						train -> stations[i].seatNum[j] = train -> seatNum;
				for (int i = 0 , l = 0 , r , len = stations.size();i < train -> stationNum;++ i , l = r + 1)
				{
					for (r = l;r < len && stations[r] != '|';++ r);
					strcpy(train -> stations[i].stationName , stations.substr(l , r - l).c_str());
				}
				for (int i = 1 , l = 0 , r , len = prices.size();i < train -> stationNum;++ i , l = r + 1)
				{
					for (r = l;r < len && prices[r] != '|';++ r);
					train -> stations[i].price = stoi(prices.substr(l , r - l));
				}
				train -> startTime = timeType(startTime);
				for (int i = 1 , l = 0 , r , len = travelTimes.size();i < train -> stationNum;++ i , l = r + 1)
				{
					for (r = l;r < len && travelTimes[r] != '|';++ r);
					train -> stations[i].travelTime = stoi(travelTimes.substr(l , r - l));
				}
				for (int i = 1 , l = 0 , r , len = stopoverTimes.size();i < train -> stationNum - 1;++ i , l = r + 1)
				{
					for (r = l;r < len && stopoverTimes[r] != '|';++ r);
					train -> stations[i].stopoverTime = stoi(stopoverTimes.substr(l , r - l));
				}
				train -> saleDate[0] = timeType(saleDate.substr(0 , 5)) , train -> saleDate[1] = timeType(saleDate.substr(6 , 5));
				train -> type = type[0];
				TrainFile -> save(train -> offset) , TrainBpTree -> insert(std::make_pair(hasher(train -> trainID) , train -> offset));
				std::cout << 0 << std::endl;
			}
		}